

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void XPMP2::_NetwGetLocalAddresses(bool bForceRefresh)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  NetRuntimeError *this;
  ifaddrs *ifaddr;
  string local_40;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  bVar1 = 30000000000 < lVar3 - (long)_NetwGetLocalAddresses::tpLastRefresh.__d.__r;
  if (gAddrLocal._40_8_ == 0 || (bVar1 || bForceRefresh)) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)mtxAddrLocal);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (bVar1 || bForceRefresh) {
      std::
      _Rb_tree<XPMP2::LocalIntfAddrTy,_XPMP2::LocalIntfAddrTy,_std::_Identity<XPMP2::LocalIntfAddrTy>,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
      ::clear((_Rb_tree<XPMP2::LocalIntfAddrTy,_XPMP2::LocalIntfAddrTy,_std::_Identity<XPMP2::LocalIntfAddrTy>,_std::less<XPMP2::LocalIntfAddrTy>,_std::allocator<XPMP2::LocalIntfAddrTy>_>
               *)gAddrLocal);
    }
    iVar2 = getifaddrs();
    if (iVar2 == -1) {
      this = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"getifaddrs failed","");
      NetRuntimeError::NetRuntimeError(this,&local_40);
      __cxa_throw(this,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    freeifaddrs(0);
    _NetwGetLocalAddresses::tpLastRefresh.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    pthread_mutex_unlock((pthread_mutex_t *)mtxAddrLocal);
  }
  return;
}

Assistant:

void _NetwGetLocalAddresses (bool bForceRefresh = false)
{
    // Every once in a while we enforce the refresh
    static std::chrono::time_point<std::chrono::steady_clock> tpLastRefresh;
    if (std::chrono::steady_clock::now() - tpLastRefresh > std::chrono::seconds(30))
        bForceRefresh = true;
    
    // Quick exit
    if (!gAddrLocal.empty() && !bForceRefresh)
        return;
        
    std::lock_guard<std::recursive_mutex> lock(mtxAddrLocal);
    if (bForceRefresh)
        gAddrLocal.clear();
    
#if IBM
    // Fetch all local interface addresses
    ULONG ret = NO_ERROR;
    ULONG bufLen = 15000;
    std::unique_ptr<IP_ADAPTER_ADDRESSES, decltype(&free)> pAddresses(nullptr, &free);
    do {
        // allocate a return buffer
        pAddresses.reset((IP_ADAPTER_ADDRESSES*)malloc(bufLen));
        if (!pAddresses) {
            LOG_MSG(logERR, "malloc failed for %lu bytes", bufLen);
            return;
        }
        // try fetching all local addresses
        ret = GetAdaptersAddresses(AF_UNSPEC, 0, NULL, pAddresses.get(), &bufLen);
        switch (ret) {
        case ERROR_NO_DATA:                 // no addresses found (?)
            return;
        case ERROR_BUFFER_OVERFLOW:         // buffer too small, but bufLen has the required size now, try again
            break;
        case NO_ERROR:                      // success
            break;
        default:
            LOG_MSG(logERR, "GetAdaptersAddresses failed with error: %ld", ret);
            return;
        }
    } while (ret == ERROR_BUFFER_OVERFLOW);

    // Walk the list of addresses and add to our own vector
    for (const IP_ADAPTER_ADDRESSES* pAddr = pAddresses.get();
         pAddr;
         pAddr = pAddr->Next)
    {
        // Only interested in IPv4/6 enabled, operative interfaces
        if (!pAddr->Ipv4Enabled && !pAddr->Ipv6Enabled)
            continue;
        if (pAddr->OperStatus != IfOperStatusUp)
            continue;

        // Convert the friendly name from wchar to char
        char ifName[26] = { 0 };                                        // zero init and passing in sizeof-1 guarantees zero-termination
        std::wcstombs(ifName, pAddr->FriendlyName, sizeof(ifName)-1);
        
        // Compiler some flags in Unix style
        uint32_t flags = IFF_UP | IFF_BROADCAST;                        // We just _assume_ it's broadcast-enabled...can't find a flag here that would tell us
        if (!pAddr->NoMulticast) flags |= IFF_MULTICAST;
        if (pAddr->IfType == IF_TYPE_SOFTWARE_LOOPBACK) flags |= IFF_LOOPBACK;
            
        // Walk the list of unicast addresses
        for (const IP_ADAPTER_UNICAST_ADDRESS* pUni = pAddr->FirstUnicastAddress;
             pUni;
             pUni = pUni->Next)
        {
            const sockaddr* pSAddr = pUni->Address.lpSockaddr;
            if (!pSAddr) continue;

            gAddrLocal.emplace(
                ifName,
                uint32_t(pSAddr->sa_family == AF_INET6 ? pAddr->Ipv6IfIndex : pAddr->IfIndex),
                pSAddr,
                flags);
        }
    }
#else
    // Fetch all local interface addresses
    struct ifaddrs *ifaddr = nullptr;
    if (getifaddrs(&ifaddr) == -1)
        throw NetRuntimeError("getifaddrs failed");

    // add valid addresses to our local cache array
    for (struct ifaddrs *ifa = ifaddr; ifa != NULL; ifa = ifa->ifa_next) {
        // ignore empty addresses and everything that is not IP
        if (ifa->ifa_addr == NULL)
            continue;
        
        // We are only interested in up&running interfaces
        if ((ifa->ifa_flags & (IFF_UP | IFF_RUNNING)) != (IFF_UP | IFF_RUNNING))
            continue;
        // We are interested in IPv4 and IPv6 interfaces only
        if (ifa->ifa_addr->sa_family != AF_INET &&
            ifa->ifa_addr->sa_family != AF_INET6)
            continue;

        // the others add to our list of local addresses
        gAddrLocal.emplace(ifa->ifa_name,
                           ifa->ifa_addr,
                           ifa->ifa_flags);
    }
    
    // free the return list
    freeifaddrs(ifaddr);
#endif
    
    // Next refresh may waitr
    tpLastRefresh = std::chrono::steady_clock::now();
}